

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1264e09::processOptions
          (anon_unknown_dwarf_1264e09 *this,cmGeneratorTarget *tgt,
          EvaluatedTargetPropertyEntries *entries,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *options,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueOptions,bool debugOptions,char *logName,OptionsParse parse,
          bool processDeviceOptions)

{
  cmMakefile **__args_1;
  char *__s;
  cmGlobalGenerator *pcVar1;
  pointer pcVar2;
  rep rVar3;
  undefined8 uVar4;
  anon_unknown_dwarf_1264e09 *paVar5;
  int iVar6;
  uint uVar7;
  undefined8 in_RAX;
  long *plVar8;
  reference pvVar9;
  size_t sVar10;
  cmake *this_00;
  undefined8 *puVar11;
  string *psVar12;
  ulong *puVar13;
  long *plVar14;
  size_type *psVar15;
  cmGlobalGenerator *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  ulong uVar16;
  undefined7 in_register_00000089;
  string *o;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  size_type __rlen;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar18;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string usedOptions;
  undefined1 local_168 [44];
  uint local_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  undefined4 local_ec;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  cmGeneratorTarget *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  anon_unknown_dwarf_1264e09 *local_40;
  cmGeneratorTarget *local_38;
  
  local_ec = (undefined4)CONCAT71(in_register_00000089,debugOptions);
  if (tgt != (cmGeneratorTarget *)entries) {
    local_13c = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),processDeviceOptions) ^ 1;
    local_118 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)options
    ;
    local_40 = this;
    local_38 = (cmGeneratorTarget *)entries;
    do {
      local_a8 = &local_98;
      local_a0 = 0;
      local_98 = 0;
      __args = tgt->GlobalGenerator;
      pcVar1 = (cmGlobalGenerator *)(tgt->ObjectDirectory)._M_dataplus._M_p;
      if (__args != pcVar1) {
        __args_1 = &tgt->Makefile;
        local_88 = tgt;
        do {
          if (processDeviceOptions) {
            pcVar2 = ((_Alloc_hider *)&__args->_vptr_cmGlobalGenerator)->_M_p;
            rVar3 = (__args->TryCompileTimeout).__r;
            if (((rVar3 != (anonymous_namespace)::DL_BEGIN) ||
                ((rVar3 != 0.0 && (iVar6 = bcmp(pcVar2,DAT_00862708,(size_t)rVar3), iVar6 != 0))))
               && ((rVar3 != (anonymous_namespace)::DL_END ||
                   ((rVar3 != 0.0 && (iVar6 = bcmp(pcVar2,DAT_00862718,(size_t)rVar3), iVar6 != 0)))
                   ))) goto LAB_00351b88;
            pvVar9 = std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                     ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                               (local_118,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__args,(cmListFileBacktrace *)__args_1);
            rVar3 = (__args->TryCompileTimeout).__r;
            if (rVar3 == (anonymous_namespace)::DL_BEGIN) {
              if (rVar3 != 0.0) {
                uVar7 = bcmp(((_Alloc_hider *)&__args->_vptr_cmGlobalGenerator)->_M_p,DAT_00862708,
                             (size_t)rVar3);
                pvVar9 = (reference)(ulong)uVar7;
                if (uVar7 != 0) goto LAB_00351c83;
              }
              local_13c = (uint)CONCAT71((int7)((ulong)pvVar9 >> 8),1);
            }
            else {
LAB_00351c83:
              local_13c = 0;
            }
          }
          else {
LAB_00351b88:
            local_168._0_8_ = uniqueOptions;
            pVar18 = std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)uniqueOptions,__args,local_168);
            if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (parse == Shell) {
                local_168._8_8_ = ((_Alloc_hider *)&__args->_vptr_cmGlobalGenerator)->_M_p;
                local_168._0_8_ = (__args->TryCompileTimeout).__r;
                __str._M_str = "SHELL:";
                __str._M_len = 6;
                iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_168,0,6
                                   ,__str);
                if (iVar6 != 0) goto LAB_00351be0;
                if ((local_13c & 1) == 0) {
                  pcVar2 = ((_Alloc_hider *)&__args->_vptr_cmGlobalGenerator)->_M_p;
                  __s = pcVar2 + 6;
                  local_168._0_8_ = local_168 + 0x10;
                  sVar10 = strlen(__s);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_168,__s,pcVar2 + sVar10 + 6);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                            (local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_168,(cmListFileBacktrace *)__args_1);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_168._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_168 + 0x10)) {
                    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
                  }
                }
                else {
                  local_168._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_168._8_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_168._16_8_ = (__buckets_ptr)0x0;
                  cmSystemTools::ParseUnixCommandLine
                            (((_Alloc_hider *)&__args->_vptr_cmGlobalGenerator)->_M_p + 6,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_168);
                  uVar4 = local_168._8_8_;
                  for (pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_168._0_8_;
                      pbVar17 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4;
                      pbVar17 = pbVar17 + 1) {
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                              (local_118,pbVar17,(cmListFileBacktrace *)__args_1);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_168);
                }
              }
              else {
LAB_00351be0:
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                          (local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __args,(cmListFileBacktrace *)__args_1);
              }
              if ((char)local_ec != '\0') {
                std::operator+(&local_138," * ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __args);
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
                local_168._0_8_ = local_168 + 0x10;
                pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (plVar8 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8 ==
                    pbVar17) {
                  local_168._16_8_ = ((_Hashtable *)&pbVar17->_M_dataplus)->_M_buckets;
                  local_168._24_8_ = plVar8[3];
                }
                else {
                  local_168._16_8_ = ((_Hashtable *)&pbVar17->_M_dataplus)->_M_buckets;
                  local_168._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
                }
                local_168._8_8_ = plVar8[1];
                *plVar8 = (long)pbVar17;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_a8,local_168._0_8_);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_168._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_168 + 0x10)) {
                  operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
          paVar5 = local_40;
          __args = (cmGlobalGenerator *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&__args->MakeSilentFlag + 1);
        } while (__args != pcVar1);
        tgt = local_88;
        if (local_a0 != 0) {
          this_00 = cmLocalGenerator::GetCMakeInstance(*(cmLocalGenerator **)(local_40 + 0x10));
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Used ","");
          plVar8 = (long *)std::__cxx11::string::append((char *)local_60);
          puVar13 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar13) {
            local_b8 = *puVar13;
            uStack_b0 = (undefined4)plVar8[3];
            uStack_ac = *(undefined4 *)((long)plVar8 + 0x1c);
            local_c8 = &local_b8;
          }
          else {
            local_b8 = *puVar13;
            local_c8 = (ulong *)*plVar8;
          }
          local_c0 = plVar8[1];
          *plVar8 = (long)puVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          local_e8 = local_d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8," for target ","");
          uVar16 = 0xf;
          if (local_c8 != &local_b8) {
            uVar16 = local_b8;
          }
          if (uVar16 < (ulong)(local_e0 + local_c0)) {
            uVar16 = 0xf;
            if (local_e8 != local_d8) {
              uVar16 = local_d8[0];
            }
            if (uVar16 < (ulong)(local_e0 + local_c0)) goto LAB_00351f20;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
          }
          else {
LAB_00351f20:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
          }
          local_110 = &local_100;
          plVar8 = puVar11 + 2;
          if ((long *)*puVar11 == plVar8) {
            local_100 = *plVar8;
            uStack_f8 = puVar11[3];
          }
          else {
            local_100 = *plVar8;
            local_110 = (long *)*puVar11;
          }
          local_108 = puVar11[1];
          *puVar11 = plVar8;
          puVar11[1] = 0;
          *(undefined1 *)plVar8 = 0;
          psVar12 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)paVar5);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_110,(ulong)(psVar12->_M_dataplus)._M_p);
          local_80 = &local_70;
          plVar14 = plVar8 + 2;
          if ((long *)*plVar8 == plVar14) {
            local_70 = *plVar14;
            lStack_68 = plVar8[3];
          }
          else {
            local_70 = *plVar14;
            local_80 = (long *)*plVar8;
          }
          local_78 = plVar8[1];
          *plVar8 = (long)plVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          psVar15 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_138.field_2._M_allocated_capacity = *psVar15;
            local_138.field_2._8_8_ = plVar8[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar15;
            local_138._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_138._M_string_length = plVar8[1];
          *plVar8 = (long)psVar15;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_a8);
          local_168._0_8_ = local_168 + 0x10;
          pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (plVar8 + 2);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8 ==
              pbVar17) {
            local_168._16_8_ = ((_Hashtable *)&pbVar17->_M_dataplus)->_M_buckets;
            local_168._24_8_ = plVar8[3];
          }
          else {
            local_168._16_8_ = ((_Hashtable *)&pbVar17->_M_dataplus)->_M_buckets;
            local_168._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
          }
          local_168._8_8_ = plVar8[1];
          *plVar8 = (long)pbVar17;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          cmake::IssueMessage(this_00,LOG,(string *)local_168,(cmListFileBacktrace *)__args_1);
          tgt = local_88;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100 + 1);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
          if (local_60[0] != local_50) {
            operator_delete(local_60[0],local_50[0] + 1);
          }
        }
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
      }
      tgt = (cmGeneratorTarget *)((tgt->ObjectDirectory).field_2._M_local_buf + 8);
    } while (tgt != local_38);
  }
  return;
}

Assistant:

void processOptions(cmGeneratorTarget const* tgt,
                    EvaluatedTargetPropertyEntries const& entries,
                    std::vector<BT<std::string>>& options,
                    std::unordered_set<std::string>& uniqueOptions,
                    bool debugOptions, const char* logName, OptionsParse parse,
                    bool processDeviceOptions = false)
{
  bool splitOption = !processDeviceOptions;
  for (EvaluatedTargetPropertyEntry const& entry : entries.Entries) {
    std::string usedOptions;
    for (std::string const& opt : entry.Values) {
      if (processDeviceOptions && (opt == DL_BEGIN || opt == DL_END)) {
        options.emplace_back(opt, entry.Backtrace);
        splitOption = opt == DL_BEGIN;
        continue;
      }

      if (uniqueOptions.insert(opt).second) {
        if (parse == OptionsParse::Shell &&
            cmHasLiteralPrefix(opt, "SHELL:")) {
          if (splitOption) {
            std::vector<std::string> tmp;
            cmSystemTools::ParseUnixCommandLine(opt.c_str() + 6, tmp);
            for (std::string& o : tmp) {
              options.emplace_back(std::move(o), entry.Backtrace);
            }
          } else {
            options.emplace_back(std::string(opt.c_str() + 6),
                                 entry.Backtrace);
          }
        } else {
          options.emplace_back(opt, entry.Backtrace);
        }
        if (debugOptions) {
          usedOptions += " * " + opt + "\n";
        }
      }
    }
    if (!usedOptions.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used ") + logName + std::string(" for target ") +
          tgt->GetName() + ":\n" + usedOptions,
        entry.Backtrace);
    }
  }
}